

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,string *value)

{
  uint length;
  char *pcVar1;
  string *value_local;
  Value *this_local;
  
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xff00 | 4;
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfeff | 0x100;
  this->comments_ = (CommentInfo *)0x0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  pcVar1 = duplicateStringValue(pcVar1,length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value( const std::string &value )
   : type_( stringValue )
   , allocated_( true )
# ifdef JSON_VALUE_USE_INTERNAL_MAP
   , itemIsUsed_( 0 )
#endif
   , comments_( 0 )
{
   value_.string_ = duplicateStringValue( value.c_str(), 
                                          (unsigned int)value.length() );

}